

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ed25519.cc
# Opt level: O3

int pkey_ed25519_keygen(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey)

{
  uint8_t *out_private_key;
  uint8_t pubkey_unused [32];
  uint8_t auStack_38 [40];
  
  out_private_key = (uint8_t *)OPENSSL_malloc(0x41);
  if (out_private_key != (uint8_t *)0x0) {
    evp_pkey_set_method(pkey,&ed25519_asn1_meth);
    ED25519_keypair(auStack_38,out_private_key);
    out_private_key[0x40] = '\x01';
    OPENSSL_free(pkey->pkey);
    pkey->pkey = out_private_key;
  }
  return (uint)(out_private_key != (uint8_t *)0x0);
}

Assistant:

static int pkey_ed25519_keygen(EVP_PKEY_CTX *ctx, EVP_PKEY *pkey) {
  ED25519_KEY *key =
      reinterpret_cast<ED25519_KEY *>(OPENSSL_malloc(sizeof(ED25519_KEY)));
  if (key == NULL) {
    return 0;
  }

  evp_pkey_set_method(pkey, &ed25519_asn1_meth);

  uint8_t pubkey_unused[32];
  ED25519_keypair(pubkey_unused, key->key);
  key->has_private = 1;

  OPENSSL_free(pkey->pkey);
  pkey->pkey = key;
  return 1;
}